

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void __thiscall gnilk::LogManager::SendToSinks(LogManager *this)

{
  pointer puVar1;
  int iVar2;
  LogEvent *this_00;
  undefined4 extraout_var;
  undefined8 uVar3;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *sinkInstance;
  pointer puVar4;
  future<int> future;
  LogSink *sink;
  deque<std::future<int>,_std::allocator<std::future<int>_>_> sinkReadyList;
  future<int> local_d8;
  pthread_mutex_t *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  LogManager *local_b0;
  element_type *local_a8;
  undefined1 local_a0 [24];
  undefined8 local_88;
  _Alloc_hider _Stack_80;
  pointer local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  undefined8 uStack_60;
  _Alloc_hider local_58;
  size_type sStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  Instance();
  local_b8 = Instance::glbManager.ipcHandler.
             super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_a8 = Instance::glbManager.ipcHandler.
             super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (Instance::glbManager.ipcHandler.
      super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (Instance::glbManager.ipcHandler.
       super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (Instance::glbManager.ipcHandler.
                      super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (Instance::glbManager.ipcHandler.
       super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (Instance::glbManager.ipcHandler.
                      super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  iVar2 = (*((this->ipcHandler).super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_LogIPCBase[4])();
  if ((char)iVar2 != '\0') {
    local_c0 = (pthread_mutex_t *)&this->sinkLock;
    iVar2 = pthread_mutex_lock(local_c0);
    if (iVar2 != 0) {
      uVar3 = std::__throw_system_error(iVar2);
      if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
      }
      _Unwind_Resume(uVar3);
    }
    local_b0 = this;
    while( true ) {
      iVar2 = (*((this->ipcHandler).
                 super___shared_ptr<gnilk::LogIPCBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_LogIPCBase[4])();
      if ((char)iVar2 == '\0') break;
      this_00 = LogCache::Next((this->cache).
                               super___shared_ptr<gnilk::LogCache,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
      iVar2 = (*local_a8->_vptr_LogIPCBase[6])();
      if (iVar2 < 0) {
        perror("SendToSinks, ipc->ReadEvent failed!");
        break;
      }
      LogEvent::ComposeReportString(this_00);
      local_48._M_allocated_capacity = 0;
      local_48._8_8_ = 0;
      local_58._M_p = (pointer)0x0;
      sStack_50 = 0;
      aStack_70._8_8_ = 0;
      uStack_60._0_4_ = kNone;
      uStack_60._4_4_ = 0;
      local_78 = (pointer)0x0;
      aStack_70._M_allocated_capacity = 0;
      local_88._0_4_ = 0;
      local_88._4_4_ = 0;
      _Stack_80._M_p = (pointer)0x0;
      std::_Deque_base<std::future<int>,_std::allocator<std::future<int>_>_>::_M_initialize_map
                ((_Deque_base<std::future<int>,_std::allocator<std::future<int>_>_> *)&local_88,0);
      puVar1 = (this->sinks).
               super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar4 = (this->sinks).
                    super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; this = local_b0, puVar4 != puVar1;
          puVar4 = puVar4 + 1) {
        iVar2 = (*((puVar4->_M_t).
                   super___uniq_ptr_impl<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gnilk::LogSinkInstance_*,_std::default_delete<gnilk::LogSinkInstance>_>
                   .super__Head_base<0UL,_gnilk::LogSinkInstance_*,_false>._M_head_impl)->
                  _vptr_LogSinkInstance[2])();
        local_a0._0_8_ = CONCAT44(extraout_var,iVar2);
        if ((*(int *)(local_a0._0_8_ + 0x30) <= (int)this_00->level) &&
           (*(char *)(local_a0._0_8_ + 8) == '\x01')) {
          local_a0._8_8_ = 0x29;
          local_a0._16_8_ = 0;
          std::
          async<int(gnilk::LogSink::*)(gnilk::LogEvent_const&),gnilk::LogSink*&,gnilk::LogEvent&>
                    ((launch)&local_d8,(offset_in_LogSink_to_subr *)0x3,(LogSink **)(local_a0 + 8),
                     (LogEvent *)local_a0);
          std::deque<std::future<int>,std::allocator<std::future<int>>>::
          emplace_back<std::future<int>>
                    ((deque<std::future<int>,std::allocator<std::future<int>>> *)&local_88,&local_d8
                    );
          if (local_d8.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d8.super___basic_future<int>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
      }
      if (local_58._M_p != local_78) {
        do {
          local_d8.super___basic_future<int>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)local_78;
          local_d8.super___basic_future<int>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_78 + 8);
          local_78[8] = '\0';
          local_78[9] = '\0';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          local_78[0] = '\0';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          std::future<int>::get(&local_d8);
          std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::pop_front
                    ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&local_88);
          if (local_d8.super___basic_future<int>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d8.super___basic_future<int>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        } while (local_58._M_p != local_78);
      }
      std::deque<std::future<int>,_std::allocator<std::future<int>_>_>::~deque
                ((deque<std::future<int>,_std::allocator<std::future<int>_>_> *)&local_88);
    }
    pthread_mutex_unlock(local_c0);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  return;
}

Assistant:

void LogManager::SendToSinks() {
    auto ipc = LogManager::Instance().GetIPC();
    if (!ipcHandler->Available()) {
        return;
    }

    std::lock_guard<std::mutex> lock(sinkLock);

    // Fetch all events from the ipc handler
    while (ipcHandler->Available()) {
        auto logEvent = cache->Next();

        if (ipc->ReadEvent(*logEvent) < 0) {
            // failed
            perror("SendToSinks, ipc->ReadEvent failed!");
            return;
        }

        logEvent->ComposeReportString();    // pre-compose the report string...
        std::deque<std::future<int>> sinkReadyList;

        for (auto &sinkInstance: sinks) {
            // This should not be problematic, except for maybe the unmanaged sink's which potentially could go out of
            // scope while we do this...
            auto sink = sinkInstance->GetSink();

            // Don't even send it unless it is within the range...
            if (!sink->WithinRange(logEvent->level)) {
                continue;
            }
            if (!sink->IsEnabled()) {
                continue;
            }

            auto future = std::async(&LogSink::Write, sink, *logEvent);
            sinkReadyList.push_back(std::move(future));
        }

        while (!sinkReadyList.empty()) {
            auto future = std::move(sinkReadyList.front());
            future.get();
            sinkReadyList.pop_front();
        }
    }
}